

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ratectrl.c
# Opt level: O0

void rc_compute_variance_onepass_rt(AV1_COMP *cpi)

{
  uint uVar1;
  long *in_RDI;
  int n;
  int m;
  uint avg;
  int j;
  int i_1;
  uint8_t src [4096];
  uint sse;
  int sbi_col;
  int sbi_row;
  uint64_t fsse;
  int sb_rows;
  int sb_cols;
  int sb_size_by_mb;
  int num_samples;
  BLOCK_SIZE bsize;
  int num_mi_rows;
  int num_mi_cols;
  int i;
  int pre_ystride;
  uint8_t *pre_y;
  YV12_BUFFER_CONFIG *yv12;
  int src_ystride;
  uint8_t *src_y;
  YV12_BUFFER_CONFIG *unscaled_src;
  AV1_COMMON *cm;
  long local_1098;
  int local_1090;
  int local_108c;
  int local_1088;
  undefined4 in_stack_ffffffffffffef7c;
  undefined4 in_stack_ffffffffffffef80;
  int iVar2;
  undefined4 in_stack_ffffffffffffef84;
  int iVar3;
  undefined1 local_1078 [60];
  int in_stack_ffffffffffffefc4;
  uint8_t *in_stack_ffffffffffffefc8;
  uint local_74;
  int local_70;
  int local_6c;
  long local_68;
  int local_5c;
  int local_58;
  int local_54;
  int local_50;
  undefined1 local_49;
  int local_48;
  int local_44;
  int local_40;
  int local_3c;
  uint8_t *local_38;
  YV12_BUFFER_CONFIG *local_30;
  int local_24;
  long local_20;
  long local_18;
  long *local_10;
  long *local_8;
  
  local_10 = in_RDI + 0x77f0;
  local_18 = in_RDI[0x84f7];
  if (local_18 != 0) {
    local_20 = *(long *)(local_18 + 0x28);
    local_24 = *(int *)(local_18 + 0x20);
    local_8 = in_RDI;
    local_30 = get_ref_frame_yv12_buf
                         ((AV1_COMMON *)
                          CONCAT44(in_stack_ffffffffffffef84,in_stack_ffffffffffffef80),
                          (MV_REFERENCE_FRAME)((uint)in_stack_ffffffffffffef7c >> 0x18));
    local_38 = (local_30->field_5).field_0.y_buffer;
    local_3c = (local_30->field_4).field_0.y_stride;
    if (local_8[0x85a7] == 0) {
      for (local_40 = 0; local_40 < 2; local_40 = local_40 + 1) {
        if (*(int *)(local_18 + (long)local_40 * 4) !=
            *(int *)((long)local_30->store_buf_adr + (long)local_40 * 4 + -0x48)) {
          return;
        }
        if (*(int *)(local_18 + 8 + (long)local_40 * 4) !=
            *(int *)((long)local_30->store_buf_adr + (long)local_40 * 4 + -0x40)) {
          return;
        }
      }
      local_44 = (int)local_10[0x43];
      local_48 = *(int *)((long)local_10 + 0x214);
      local_49 = 0xc;
      local_50 = 0;
      if (*(char *)(local_10[0xc11] + 0x1c) == '\x0f') {
        local_1090 = *(int *)(local_10[0xc11] + 0x20) >> 1;
      }
      else {
        local_1090 = *(int *)(local_10[0xc11] + 0x20);
      }
      local_54 = local_1090;
      local_58 = (local_44 + local_1090 + -1) / local_1090;
      local_5c = (local_48 + local_1090 + -1) / local_1090;
      local_68 = 0;
      local_8[0x13aca] = 0;
      for (local_6c = 0; local_6c < local_5c; local_6c = local_6c + 1) {
        for (local_70 = 0; local_70 < local_58; local_70 = local_70 + 1) {
          memset(local_1078,0,0x1000);
          for (iVar3 = 0; iVar3 < 0x40; iVar3 = iVar3 + 4) {
            for (iVar2 = 0; iVar2 < 0x40; iVar2 = iVar2 + 4) {
              uVar1 = aom_avg_4x4_sse2(in_stack_ffffffffffffefc8,in_stack_ffffffffffffefc4);
              for (local_1088 = 0; local_1088 < 4; local_1088 = local_1088 + 1) {
                for (local_108c = 0; local_108c < 4; local_108c = local_108c + 1) {
                  local_1078[iVar3 * 0x40 + iVar2 + local_1088 * 0x40 + local_108c] = (char)uVar1;
                }
              }
            }
          }
          (**(code **)(*local_8 + 0xce58))(local_1078,0x40,local_38,local_3c,&local_74);
          local_68 = (ulong)local_74 + local_68;
          local_50 = local_50 + 1;
          local_20 = local_20 + 0x40;
          local_38 = local_38 + 0x40;
        }
        local_20 = local_20 + (local_24 * 0x40 + local_58 * -0x40);
        local_38 = local_38 + (local_3c * 0x40 + local_58 * -0x40);
      }
      if (0 < local_50) {
        if (local_68 == 0) {
          local_1098 = 1;
        }
        else {
          local_1098 = local_68;
        }
        local_8[0x13aca] = local_1098;
      }
    }
  }
  return;
}

Assistant:

static void rc_compute_variance_onepass_rt(AV1_COMP *cpi) {
  AV1_COMMON *const cm = &cpi->common;
  YV12_BUFFER_CONFIG const *const unscaled_src = cpi->unscaled_source;
  if (unscaled_src == NULL) return;

  const uint8_t *src_y = unscaled_src->y_buffer;
  const int src_ystride = unscaled_src->y_stride;
  const YV12_BUFFER_CONFIG *yv12 = get_ref_frame_yv12_buf(cm, LAST_FRAME);
  const uint8_t *pre_y = yv12->buffers[0];
  const int pre_ystride = yv12->strides[0];

  // TODO(yunqing): support scaled reference frames.
  if (cpi->scaled_ref_buf[LAST_FRAME - 1]) return;

  for (int i = 0; i < 2; ++i) {
    if (unscaled_src->widths[i] != yv12->widths[i] ||
        unscaled_src->heights[i] != yv12->heights[i]) {
      return;
    }
  }

  const int num_mi_cols = cm->mi_params.mi_cols;
  const int num_mi_rows = cm->mi_params.mi_rows;
  const BLOCK_SIZE bsize = BLOCK_64X64;
  int num_samples = 0;
  // sse is computed on 64x64 blocks
  const int sb_size_by_mb = (cm->seq_params->sb_size == BLOCK_128X128)
                                ? (cm->seq_params->mib_size >> 1)
                                : cm->seq_params->mib_size;
  const int sb_cols = (num_mi_cols + sb_size_by_mb - 1) / sb_size_by_mb;
  const int sb_rows = (num_mi_rows + sb_size_by_mb - 1) / sb_size_by_mb;

  uint64_t fsse = 0;
  cpi->rec_sse = 0;

  for (int sbi_row = 0; sbi_row < sb_rows; ++sbi_row) {
    for (int sbi_col = 0; sbi_col < sb_cols; ++sbi_col) {
      unsigned int sse;
      uint8_t src[64 * 64] = { 0 };
      // Apply 4x4 block averaging/denoising on source frame.
      for (int i = 0; i < 64; i += 4) {
        for (int j = 0; j < 64; j += 4) {
          const unsigned int avg =
              aom_avg_4x4(src_y + i * src_ystride + j, src_ystride);

          for (int m = 0; m < 4; ++m) {
            for (int n = 0; n < 4; ++n) src[i * 64 + j + m * 64 + n] = avg;
          }
        }
      }

      cpi->ppi->fn_ptr[bsize].vf(src, 64, pre_y, pre_ystride, &sse);
      fsse += sse;
      num_samples++;
      src_y += 64;
      pre_y += 64;
    }
    src_y += (src_ystride << 6) - (sb_cols << 6);
    pre_y += (pre_ystride << 6) - (sb_cols << 6);
  }
  assert(num_samples > 0);
  // Ensure rec_sse > 0
  if (num_samples > 0) cpi->rec_sse = fsse > 0 ? fsse : 1;
}